

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O1

void __thiscall
soul::heart::Parser::scanFunction(Parser *this,ScannedTopLevelItem *item,bool isEventFunction)

{
  Module *pMVar1;
  size_t sVar2;
  pointer pcVar3;
  size_type sVar4;
  iterator iVar5;
  char *__s1;
  ScannedTopLevelItem *pSVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  Function *pFVar10;
  undefined7 in_register_00000011;
  long lVar11;
  Identifier *in_R9;
  pool_ref<soul::heart::Function> *ppVar12;
  string_view other;
  string_view other_00;
  Identifier name;
  string *local_a0;
  Function *local_98;
  ScannedTopLevelItem *local_90;
  CompileMessage local_88;
  string local_50;
  
  local_a0 = (string *)parseGeneralIdentifier(this);
  iVar9 = (int)CONCAT71(in_register_00000011,isEventFunction);
  if (iVar9 != 0) {
    if (local_a0 == (string *)0x0) goto LAB_00230ed2;
    bVar7 = isReservedFunctionName(local_a0);
    if (bVar7) {
      CompileMessageHelpers::createMessage<soul::Identifier&>
                (&local_88,(CompileMessageHelpers *)0x1,none,0x28729e,(char *)&local_a0,in_R9);
      (*(this->
        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        )._vptr_Tokeniser[2])(this,&local_88);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_88.location.sourceCode.object);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.description._M_dataplus._M_p != &local_88.description.field_2) {
        operator_delete(local_88.description._M_dataplus._M_p,
                        local_88.description.field_2._M_allocated_capacity + 1);
      }
    }
  }
  pMVar1 = (this->module).object;
  if (pMVar1 == (Module *)0x0) goto LAB_00230eba;
  local_98 = (Function *)CONCAT44(local_98._4_4_,iVar9);
  local_90 = item;
  if (local_a0 == (string *)0x0) {
    throwInternalCompilerError("isValid()","operator basic_string_view",0x22);
  }
  sVar2 = (pMVar1->functions).functions.numActive;
  bVar7 = sVar2 == 0;
  if (bVar7) {
LAB_00230c5b:
    pFVar10 = (Function *)0x0;
  }
  else {
    pcVar3 = (local_a0->_M_dataplus)._M_p;
    sVar4 = local_a0->_M_string_length;
    ppVar12 = (pMVar1->functions).functions.items;
    other._M_str = pcVar3;
    other._M_len = sVar4;
    bVar8 = Identifier::operator==(&ppVar12->object->name,other);
    if (!bVar8) {
      lVar11 = sVar2 * 8;
      do {
        lVar11 = lVar11 + -8;
        bVar7 = lVar11 == 0;
        if (bVar7) goto LAB_00230c5b;
        ppVar12 = ppVar12 + 1;
        other_00._M_str = pcVar3;
        other_00._M_len = sVar4;
        bVar8 = Identifier::operator==(&ppVar12->object->name,other_00);
      } while (!bVar8);
    }
    if (bVar7) goto LAB_00230c5b;
    pFVar10 = ppVar12->object;
  }
  if (pFVar10 != (Function *)0x0) {
    CompileMessageHelpers::createMessage<soul::Identifier&>
              (&local_88,(CompileMessageHelpers *)0x1,none,0x284f23,(char *)&local_a0,in_R9);
    (*(this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      )._vptr_Tokeniser[2])(this,&local_88);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_88.location.sourceCode.object);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88.description._M_dataplus._M_p != &local_88.description.field_2) {
      operator_delete(local_88.description._M_dataplus._M_p,
                      local_88.description.field_2._M_allocated_capacity + 1);
    }
  }
  pMVar1 = (this->module).object;
  if (pMVar1 != (Module *)0x0) {
    if (local_a0 != (string *)0x0) {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar3,pcVar3 + local_a0->_M_string_length);
      pFVar10 = Module::Functions::add(&pMVar1->functions,&local_50,local_98._0_1_);
      pSVar6 = local_90;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      expect<soul::TokenType>
                (&this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                 ,(TokenType)0x288ebc);
      local_88.description._M_dataplus._M_p =
           (this->
           super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
           ).location.location.data;
      iVar5._M_current =
           (pSVar6->functionParamCode).
           super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_98 = pFVar10;
      if (iVar5._M_current ==
          (pSVar6->functionParamCode).
          super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>::
        _M_realloc_insert<soul::UTF8Reader>
                  (&pSVar6->functionParamCode,iVar5,(UTF8Reader *)&local_88);
      }
      else {
        (iVar5._M_current)->data = local_88.description._M_dataplus._M_p;
        (pSVar6->functionParamCode).
        super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      skipPastNextOccurrenceOf(this,(TokenType)0x286aae);
      bVar7 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ::matchIf<soul::TokenType>
                        (&this->
                          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                         ,(TokenType)0x263760);
      while( true ) {
        if (bVar7) {
          local_88.description._M_dataplus._M_p =
               (this->
               super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ).location.location.data;
          iVar5._M_current =
               (local_90->functionBodyCode).
               super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (local_90->functionBodyCode).
              super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>::
            _M_realloc_insert<soul::UTF8Reader>
                      (&local_90->functionBodyCode,iVar5,(UTF8Reader *)&local_88);
          }
          else {
            (iVar5._M_current)->data = local_88.description._M_dataplus._M_p;
            (local_90->functionBodyCode).
            super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          }
          skipPastNextOccurrenceOf(this,(TokenType)0x26223a);
          return;
        }
        bVar7 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ::matchIf<soul::TokenType>
                          (&this->
                            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                           ,(TokenType)0x261d5f);
        if (bVar7) break;
        bVar7 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ::matchIf<soul::TokenType>
                          (&this->
                            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                           ,(TokenType)0x263762);
        if (bVar7) {
          skipPastNextOccurrenceOf(this,(TokenType)0x26346e);
        }
        else {
          __s1 = (this->
                 super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                 ).currentType.text;
          if ((__s1 == "$eof") ||
             ((__s1 != (char *)0x0 && (iVar9 = strcmp(__s1,"$eof"), iVar9 == 0)))) {
            Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::expect<soul::TokenType>
                      (&this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ,(TokenType)0x263760);
          }
          Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::skip(&this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                );
        }
        bVar7 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ::matchIf<soul::TokenType>
                          (&this->
                            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                           ,(TokenType)0x263760);
      }
      local_98->hasNoBody = true;
      local_88.description._M_dataplus._M_p = (pointer)0x0;
      iVar5._M_current =
           (local_90->functionBodyCode).
           super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current !=
          (local_90->functionBodyCode).
          super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        (iVar5._M_current)->data = (char *)0x0;
        (local_90->functionBodyCode).
        super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        return;
      }
      std::vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>::
      _M_realloc_insert<soul::UTF8Reader>(&local_90->functionBodyCode,iVar5,(UTF8Reader *)&local_88)
      ;
      return;
    }
LAB_00230ed2:
    throwInternalCompilerError("isValid()","operator const std::basic_string<char> &",0x21);
  }
LAB_00230eba:
  throwInternalCompilerError("object != nullptr","operator->",0x3c);
}

Assistant:

void scanFunction (ScannedTopLevelItem& item, bool isEventFunction)
    {
        auto name = parseGeneralIdentifier();

        if (isEventFunction && heart::isReservedFunctionName (name))
            throwError (Errors::invalidEndpointName (name));

        if (module->functions.find (name) != nullptr)
            throwError (Errors::nameInUse (name));

        auto& fn = module->functions.add (name, isEventFunction);

        expect (HEARTOperator::openParen);
        item.functionParamCode.push_back (getCurrentTokeniserPosition());
        skipPastNextOccurrenceOf (HEARTOperator::closeParen);

        for (;;)
        {
            if (matchIf (HEARTOperator::openBrace))
            {
                item.functionBodyCode.push_back (getCurrentTokeniserPosition());
                skipPastNextOccurrenceOf (HEARTOperator::closeBrace);
                break;
            }

            if (matchIf (HEARTOperator::semicolon))
            {
                fn.hasNoBody = true;
                item.functionBodyCode.push_back ({});
                break;
            }

            if (matchIf (HEARTOperator::openDoubleBracket))
            {
                skipPastNextOccurrenceOf (HEARTOperator::closeDoubleBracket);
                continue;
            }

            if (matches (Token::eof))
                expect (HEARTOperator::openBrace);

            skip();
        }
    }